

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O1

UTrie2 * utrie2_open_63(uint32_t initialValue,uint32_t errorValue,UErrorCode *pErrorCode)

{
  UTrie2 *buffer;
  UNewTrie2 *buffer_00;
  uint32_t *buffer_01;
  long lVar1;
  int32_t *piVar2;
  UNewTrie2 *pUVar3;
  uint c;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    buffer = (UTrie2 *)uprv_malloc_63(0x50);
    buffer_00 = (UNewTrie2 *)uprv_malloc_63(0x453c0);
    buffer_01 = (uint32_t *)uprv_malloc_63(0x10000);
    if ((buffer_00 != (UNewTrie2 *)0x0 && buffer != (UTrie2 *)0x0) && buffer_01 != (uint32_t *)0x0)
    {
      buffer->index2NullOffset = 0;
      buffer->dataNullOffset = 0;
      buffer->initialValue = 0;
      buffer->errorValue = 0;
      buffer->highStart = 0;
      buffer->length = 0;
      buffer->isMemoryOwned = '\0';
      buffer->padding1 = '\0';
      buffer->padding2 = 0;
      buffer->newTrie = (UNewTrie2 *)0x0;
      *(undefined8 *)&buffer->highValueIndex = 0;
      buffer->memory = (void *)0x0;
      buffer->data32 = (uint32_t *)0x0;
      buffer->indexLength = 0;
      buffer->dataLength = 0;
      buffer->index = (uint16_t *)0x0;
      buffer->data16 = (uint16_t *)0x0;
      buffer->initialValue = initialValue;
      buffer->errorValue = errorValue;
      buffer->highStart = 0x110000;
      buffer->newTrie = buffer_00;
      buffer_00->data = buffer_01;
      buffer_00->dataCapacity = 0x4000;
      buffer_00->initialValue = initialValue;
      buffer_00->errorValue = errorValue;
      buffer_00->highStart = 0x110000;
      buffer_00->firstFreeBlock = 0;
      buffer_00->isCompacted = '\0';
      lVar1 = 0;
      do {
        buffer_01[lVar1] = initialValue;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x80);
      lVar1 = 0;
      do {
        buffer_01[lVar1 + 0x80] = errorValue;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x40);
      lVar1 = 0;
      do {
        buffer_01[lVar1 + 0xc0] = initialValue;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x40);
      buffer_00->dataNullOffset = 0xc0;
      buffer_00->dataLength = 0x100;
      piVar2 = buffer_00->index2;
      lVar1 = 0;
      do {
        *piVar2 = (int32_t)lVar1;
        piVar2[0x8aac] = 1;
        piVar2 = piVar2 + 1;
        lVar1 = lVar1 + 0x20;
      } while (lVar1 != 0x80);
      buffer_00->map[4] = 0;
      buffer_00->map[5] = 0;
      buffer_00->map[6] = 0x881d;
      buffer_00->map[7] = 0;
      lVar1 = 0x224;
      do {
        buffer_00->index1[lVar1] = 0xc0;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0xa40);
      memset(buffer_00->index2 + 0x820,0xff,0x900);
      lVar1 = 0;
      do {
        buffer_00->index2[lVar1 + 0xa60] = 0xc0;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x40);
      buffer_00->index2NullOffset = 0xa60;
      buffer_00->index2Length = 0xaa0;
      lVar1 = 0;
      pUVar3 = buffer_00;
      do {
        pUVar3->index1[0] = (int32_t)lVar1;
        pUVar3 = (UNewTrie2 *)(pUVar3->index1 + 1);
        lVar1 = lVar1 + 0x40;
      } while (lVar1 != 0x800);
      lVar1 = 0;
      do {
        buffer_00->index1[lVar1 + 0x20] = 0xa60;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x200);
      c = 0x60;
      do {
        c = c + 0x20;
        if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          set32(buffer->newTrie,c,'\x01',initialValue,pErrorCode);
        }
      } while (c < 0x7e0);
      return buffer;
    }
    uprv_free_63(buffer);
    uprv_free_63(buffer_00);
    uprv_free_63(buffer_01);
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  return (UTrie2 *)0x0;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_set32ForLeadSurrogateCodeUnit(UTrie2 *trie,
                                     UChar32 c, uint32_t value,
                                     UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    if(!U_IS_LEAD(c)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    set32(trie->newTrie, c, FALSE, value, pErrorCode);
}